

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_lite_unittest.pb.cc
# Opt level: O2

uint8_t * __thiscall
proto2_unittest::TestMapLite::_InternalSerialize
          (TestMapLite *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  MapFieldLite<long,_long> *pMVar1;
  MapFieldLite<unsigned_int,_unsigned_int> *pMVar2;
  MapFieldLite<unsigned_long,_unsigned_long> *pMVar3;
  MapFieldLite<int,_int> *pMVar4;
  MapFieldLite<int,_float> *this_00;
  MapFieldLite<int,_double> *this_01;
  MapFieldLite<bool,_bool> *this_02;
  MapFieldLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_03;
  MapFieldLite<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_04;
  MapFieldLite<int,_proto2_unittest::MapEnumLite> *this_05;
  MapFieldLite<int,_proto2_unittest::ForeignMessageLite> *this_06;
  int iVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  ulong uVar6;
  UntypedMapBase *pUVar7;
  long lVar8;
  long lVar9;
  const_iterator __begin3;
  
  if (*(int *)&this->field_0 != 0) {
    if ((*(int *)&this->field_0 == 1) || (stream->is_serialization_deterministic_ == false)) {
      google::protobuf::internal::UntypedMapBase::begin
                (&__begin3.super_UntypedMapIterator,(UntypedMapBase *)&(this->field_0)._impl_);
      while (__begin3.super_UntypedMapIterator.node_ != (NodeBase *)0x0) {
        target = google::protobuf::internal::
                 MapEntryFuncs<int,_int,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)5>
                 ::InternalSerialize(1,(int *)(__begin3.super_UntypedMapIterator.node_ + 1),
                                     (int *)((long)&__begin3.super_UntypedMapIterator.node_[1].next
                                            + 4),target,stream);
        google::protobuf::internal::UntypedMapIterator::PlusPlus(&__begin3.super_UntypedMapIterator)
        ;
      }
    }
    else {
      google::protobuf::internal::MapSorterFlat<google::protobuf::Map<int,_int>_>::MapSorterFlat
                ((MapSorterFlat<google::protobuf::Map<int,_int>_> *)&__begin3,
                 (Map<int,_int> *)&(this->field_0)._impl_);
      pUVar7 = __begin3.super_UntypedMapIterator.m_;
      for (lVar8 = (long)__begin3.super_UntypedMapIterator.node_ << 4; lVar8 != 0;
          lVar8 = lVar8 + -0x10) {
        target = google::protobuf::internal::
                 MapEntryFuncs<int,_int,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)5>
                 ::InternalSerialize(1,*(int **)&pUVar7->index_of_first_non_null_,
                                     *(int **)&pUVar7->index_of_first_non_null_ + 1,target,stream);
        pUVar7 = (UntypedMapBase *)&pUVar7->table_;
      }
      std::
      unique_ptr<std::pair<int,_const_void_*>[],_std::default_delete<std::pair<int,_const_void_*>[]>_>
      ::~unique_ptr((unique_ptr<std::pair<int,_const_void_*>[],_std::default_delete<std::pair<int,_const_void_*>[]>_>
                     *)&__begin3.super_UntypedMapIterator.m_);
    }
  }
  iVar5 = *(int *)((long)&this->field_0 + 0x20);
  if (iVar5 != 0) {
    pMVar1 = &(this->field_0)._impl_.map_int64_int64_;
    if ((iVar5 == 1) || (stream->is_serialization_deterministic_ == false)) {
      google::protobuf::internal::UntypedMapBase::begin
                (&__begin3.super_UntypedMapIterator,(UntypedMapBase *)pMVar1);
      while (__begin3.super_UntypedMapIterator.node_ != (NodeBase *)0x0) {
        target = google::protobuf::internal::
                 MapEntryFuncs<long,_long,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)3>
                 ::InternalSerialize(2,(long *)(__begin3.super_UntypedMapIterator.node_ + 1),
                                     (long *)(__begin3.super_UntypedMapIterator.node_ + 2),target,
                                     stream);
        google::protobuf::internal::UntypedMapIterator::PlusPlus(&__begin3.super_UntypedMapIterator)
        ;
      }
    }
    else {
      google::protobuf::internal::MapSorterFlat<google::protobuf::Map<long,_long>_>::MapSorterFlat
                ((MapSorterFlat<google::protobuf::Map<long,_long>_> *)&__begin3,
                 (Map<long,_long> *)pMVar1);
      pUVar7 = __begin3.super_UntypedMapIterator.m_;
      for (lVar8 = (long)__begin3.super_UntypedMapIterator.node_ << 4; lVar8 != 0;
          lVar8 = lVar8 + -0x10) {
        target = google::protobuf::internal::
                 MapEntryFuncs<long,_long,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)3>
                 ::InternalSerialize(2,*(long **)&pUVar7->index_of_first_non_null_,
                                     *(long **)&pUVar7->index_of_first_non_null_ + 1,target,stream);
        pUVar7 = (UntypedMapBase *)&pUVar7->table_;
      }
      std::
      unique_ptr<std::pair<long,_const_void_*>[],_std::default_delete<std::pair<long,_const_void_*>[]>_>
      ::~unique_ptr((unique_ptr<std::pair<long,_const_void_*>[],_std::default_delete<std::pair<long,_const_void_*>[]>_>
                     *)&__begin3.super_UntypedMapIterator.m_);
    }
  }
  iVar5 = *(int *)((long)&this->field_0 + 0x40);
  if (iVar5 != 0) {
    pMVar2 = &(this->field_0)._impl_.map_uint32_uint32_;
    if ((iVar5 == 1) || (stream->is_serialization_deterministic_ == false)) {
      google::protobuf::internal::UntypedMapBase::begin
                (&__begin3.super_UntypedMapIterator,(UntypedMapBase *)pMVar2);
      while (__begin3.super_UntypedMapIterator.node_ != (NodeBase *)0x0) {
        target = google::protobuf::internal::
                 MapEntryFuncs<unsigned_int,_unsigned_int,_(google::protobuf::internal::WireFormatLite::FieldType)13,_(google::protobuf::internal::WireFormatLite::FieldType)13>
                 ::InternalSerialize(3,(uint *)(__begin3.super_UntypedMapIterator.node_ + 1),
                                     (uint *)((long)&__begin3.super_UntypedMapIterator.node_[1].next
                                             + 4),target,stream);
        google::protobuf::internal::UntypedMapIterator::PlusPlus(&__begin3.super_UntypedMapIterator)
        ;
      }
    }
    else {
      google::protobuf::internal::MapSorterFlat<google::protobuf::Map<unsigned_int,_unsigned_int>_>
      ::MapSorterFlat((MapSorterFlat<google::protobuf::Map<unsigned_int,_unsigned_int>_> *)&__begin3
                      ,(Map<unsigned_int,_unsigned_int> *)pMVar2);
      pUVar7 = __begin3.super_UntypedMapIterator.m_;
      for (lVar8 = (long)__begin3.super_UntypedMapIterator.node_ << 4; lVar8 != 0;
          lVar8 = lVar8 + -0x10) {
        target = google::protobuf::internal::
                 MapEntryFuncs<unsigned_int,_unsigned_int,_(google::protobuf::internal::WireFormatLite::FieldType)13,_(google::protobuf::internal::WireFormatLite::FieldType)13>
                 ::InternalSerialize(3,*(uint **)&pUVar7->index_of_first_non_null_,
                                     *(uint **)&pUVar7->index_of_first_non_null_ + 1,target,stream);
        pUVar7 = (UntypedMapBase *)&pUVar7->table_;
      }
      std::
      unique_ptr<std::pair<unsigned_int,_const_void_*>[],_std::default_delete<std::pair<unsigned_int,_const_void_*>[]>_>
      ::~unique_ptr((unique_ptr<std::pair<unsigned_int,_const_void_*>[],_std::default_delete<std::pair<unsigned_int,_const_void_*>[]>_>
                     *)&__begin3.super_UntypedMapIterator.m_);
    }
  }
  iVar5 = *(int *)((long)&this->field_0 + 0x60);
  if (iVar5 != 0) {
    pMVar3 = &(this->field_0)._impl_.map_uint64_uint64_;
    if ((iVar5 == 1) || (stream->is_serialization_deterministic_ == false)) {
      google::protobuf::internal::UntypedMapBase::begin
                (&__begin3.super_UntypedMapIterator,(UntypedMapBase *)pMVar3);
      while (__begin3.super_UntypedMapIterator.node_ != (NodeBase *)0x0) {
        target = google::protobuf::internal::
                 MapEntryFuncs<unsigned_long,_unsigned_long,_(google::protobuf::internal::WireFormatLite::FieldType)4,_(google::protobuf::internal::WireFormatLite::FieldType)4>
                 ::InternalSerialize(4,(unsigned_long *)
                                       (__begin3.super_UntypedMapIterator.node_ + 1),
                                     (unsigned_long *)(__begin3.super_UntypedMapIterator.node_ + 2),
                                     target,stream);
        google::protobuf::internal::UntypedMapIterator::PlusPlus(&__begin3.super_UntypedMapIterator)
        ;
      }
    }
    else {
      google::protobuf::internal::
      MapSorterFlat<google::protobuf::Map<unsigned_long,_unsigned_long>_>::MapSorterFlat
                ((MapSorterFlat<google::protobuf::Map<unsigned_long,_unsigned_long>_> *)&__begin3,
                 (Map<unsigned_long,_unsigned_long> *)pMVar3);
      pUVar7 = __begin3.super_UntypedMapIterator.m_;
      for (lVar8 = (long)__begin3.super_UntypedMapIterator.node_ << 4; lVar8 != 0;
          lVar8 = lVar8 + -0x10) {
        target = google::protobuf::internal::
                 MapEntryFuncs<unsigned_long,_unsigned_long,_(google::protobuf::internal::WireFormatLite::FieldType)4,_(google::protobuf::internal::WireFormatLite::FieldType)4>
                 ::InternalSerialize(4,*(unsigned_long **)&pUVar7->index_of_first_non_null_,
                                     *(unsigned_long **)&pUVar7->index_of_first_non_null_ + 1,target
                                     ,stream);
        pUVar7 = (UntypedMapBase *)&pUVar7->table_;
      }
      std::
      unique_ptr<std::pair<unsigned_long,_const_void_*>[],_std::default_delete<std::pair<unsigned_long,_const_void_*>[]>_>
      ::~unique_ptr((unique_ptr<std::pair<unsigned_long,_const_void_*>[],_std::default_delete<std::pair<unsigned_long,_const_void_*>[]>_>
                     *)&__begin3.super_UntypedMapIterator.m_);
    }
  }
  iVar5 = *(int *)((long)&this->field_0 + 0x80);
  if (iVar5 != 0) {
    pMVar4 = &(this->field_0)._impl_.map_sint32_sint32_;
    if ((iVar5 == 1) || (stream->is_serialization_deterministic_ == false)) {
      google::protobuf::internal::UntypedMapBase::begin
                (&__begin3.super_UntypedMapIterator,(UntypedMapBase *)pMVar4);
      while (__begin3.super_UntypedMapIterator.node_ != (NodeBase *)0x0) {
        target = google::protobuf::internal::
                 MapEntryFuncs<int,_int,_(google::protobuf::internal::WireFormatLite::FieldType)17,_(google::protobuf::internal::WireFormatLite::FieldType)17>
                 ::InternalSerialize(5,(int *)(__begin3.super_UntypedMapIterator.node_ + 1),
                                     (int *)((long)&__begin3.super_UntypedMapIterator.node_[1].next
                                            + 4),target,stream);
        google::protobuf::internal::UntypedMapIterator::PlusPlus(&__begin3.super_UntypedMapIterator)
        ;
      }
    }
    else {
      google::protobuf::internal::MapSorterFlat<google::protobuf::Map<int,_int>_>::MapSorterFlat
                ((MapSorterFlat<google::protobuf::Map<int,_int>_> *)&__begin3,
                 (Map<int,_int> *)pMVar4);
      pUVar7 = __begin3.super_UntypedMapIterator.m_;
      for (lVar8 = (long)__begin3.super_UntypedMapIterator.node_ << 4; lVar8 != 0;
          lVar8 = lVar8 + -0x10) {
        target = google::protobuf::internal::
                 MapEntryFuncs<int,_int,_(google::protobuf::internal::WireFormatLite::FieldType)17,_(google::protobuf::internal::WireFormatLite::FieldType)17>
                 ::InternalSerialize(5,*(int **)&pUVar7->index_of_first_non_null_,
                                     *(int **)&pUVar7->index_of_first_non_null_ + 1,target,stream);
        pUVar7 = (UntypedMapBase *)&pUVar7->table_;
      }
      std::
      unique_ptr<std::pair<int,_const_void_*>[],_std::default_delete<std::pair<int,_const_void_*>[]>_>
      ::~unique_ptr((unique_ptr<std::pair<int,_const_void_*>[],_std::default_delete<std::pair<int,_const_void_*>[]>_>
                     *)&__begin3.super_UntypedMapIterator.m_);
    }
  }
  iVar5 = *(int *)((long)&this->field_0 + 0xa0);
  if (iVar5 != 0) {
    pMVar1 = &(this->field_0)._impl_.map_sint64_sint64_;
    if ((iVar5 == 1) || (stream->is_serialization_deterministic_ == false)) {
      google::protobuf::internal::UntypedMapBase::begin
                (&__begin3.super_UntypedMapIterator,(UntypedMapBase *)pMVar1);
      while (__begin3.super_UntypedMapIterator.node_ != (NodeBase *)0x0) {
        target = google::protobuf::internal::
                 MapEntryFuncs<long,_long,_(google::protobuf::internal::WireFormatLite::FieldType)18,_(google::protobuf::internal::WireFormatLite::FieldType)18>
                 ::InternalSerialize(6,(long *)(__begin3.super_UntypedMapIterator.node_ + 1),
                                     (long *)(__begin3.super_UntypedMapIterator.node_ + 2),target,
                                     stream);
        google::protobuf::internal::UntypedMapIterator::PlusPlus(&__begin3.super_UntypedMapIterator)
        ;
      }
    }
    else {
      google::protobuf::internal::MapSorterFlat<google::protobuf::Map<long,_long>_>::MapSorterFlat
                ((MapSorterFlat<google::protobuf::Map<long,_long>_> *)&__begin3,
                 (Map<long,_long> *)pMVar1);
      pUVar7 = __begin3.super_UntypedMapIterator.m_;
      for (lVar8 = (long)__begin3.super_UntypedMapIterator.node_ << 4; lVar8 != 0;
          lVar8 = lVar8 + -0x10) {
        target = google::protobuf::internal::
                 MapEntryFuncs<long,_long,_(google::protobuf::internal::WireFormatLite::FieldType)18,_(google::protobuf::internal::WireFormatLite::FieldType)18>
                 ::InternalSerialize(6,*(long **)&pUVar7->index_of_first_non_null_,
                                     *(long **)&pUVar7->index_of_first_non_null_ + 1,target,stream);
        pUVar7 = (UntypedMapBase *)&pUVar7->table_;
      }
      std::
      unique_ptr<std::pair<long,_const_void_*>[],_std::default_delete<std::pair<long,_const_void_*>[]>_>
      ::~unique_ptr((unique_ptr<std::pair<long,_const_void_*>[],_std::default_delete<std::pair<long,_const_void_*>[]>_>
                     *)&__begin3.super_UntypedMapIterator.m_);
    }
  }
  iVar5 = *(int *)((long)&this->field_0 + 0xc0);
  if (iVar5 != 0) {
    pMVar2 = &(this->field_0)._impl_.map_fixed32_fixed32_;
    if ((iVar5 == 1) || (stream->is_serialization_deterministic_ == false)) {
      google::protobuf::internal::UntypedMapBase::begin
                (&__begin3.super_UntypedMapIterator,(UntypedMapBase *)pMVar2);
      while (__begin3.super_UntypedMapIterator.node_ != (NodeBase *)0x0) {
        target = google::protobuf::internal::
                 MapEntryFuncs<unsigned_int,_unsigned_int,_(google::protobuf::internal::WireFormatLite::FieldType)7,_(google::protobuf::internal::WireFormatLite::FieldType)7>
                 ::InternalSerialize(7,(uint *)(__begin3.super_UntypedMapIterator.node_ + 1),
                                     (uint *)((long)&__begin3.super_UntypedMapIterator.node_[1].next
                                             + 4),target,stream);
        google::protobuf::internal::UntypedMapIterator::PlusPlus(&__begin3.super_UntypedMapIterator)
        ;
      }
    }
    else {
      google::protobuf::internal::MapSorterFlat<google::protobuf::Map<unsigned_int,_unsigned_int>_>
      ::MapSorterFlat((MapSorterFlat<google::protobuf::Map<unsigned_int,_unsigned_int>_> *)&__begin3
                      ,(Map<unsigned_int,_unsigned_int> *)pMVar2);
      pUVar7 = __begin3.super_UntypedMapIterator.m_;
      for (lVar8 = (long)__begin3.super_UntypedMapIterator.node_ << 4; lVar8 != 0;
          lVar8 = lVar8 + -0x10) {
        target = google::protobuf::internal::
                 MapEntryFuncs<unsigned_int,_unsigned_int,_(google::protobuf::internal::WireFormatLite::FieldType)7,_(google::protobuf::internal::WireFormatLite::FieldType)7>
                 ::InternalSerialize(7,*(uint **)&pUVar7->index_of_first_non_null_,
                                     *(uint **)&pUVar7->index_of_first_non_null_ + 1,target,stream);
        pUVar7 = (UntypedMapBase *)&pUVar7->table_;
      }
      std::
      unique_ptr<std::pair<unsigned_int,_const_void_*>[],_std::default_delete<std::pair<unsigned_int,_const_void_*>[]>_>
      ::~unique_ptr((unique_ptr<std::pair<unsigned_int,_const_void_*>[],_std::default_delete<std::pair<unsigned_int,_const_void_*>[]>_>
                     *)&__begin3.super_UntypedMapIterator.m_);
    }
  }
  iVar5 = *(int *)((long)&this->field_0 + 0xe0);
  if (iVar5 != 0) {
    pMVar3 = &(this->field_0)._impl_.map_fixed64_fixed64_;
    if ((iVar5 == 1) || (stream->is_serialization_deterministic_ == false)) {
      google::protobuf::internal::UntypedMapBase::begin
                (&__begin3.super_UntypedMapIterator,(UntypedMapBase *)pMVar3);
      while (__begin3.super_UntypedMapIterator.node_ != (NodeBase *)0x0) {
        target = google::protobuf::internal::
                 MapEntryFuncs<unsigned_long,_unsigned_long,_(google::protobuf::internal::WireFormatLite::FieldType)6,_(google::protobuf::internal::WireFormatLite::FieldType)6>
                 ::InternalSerialize(8,(unsigned_long *)
                                       (__begin3.super_UntypedMapIterator.node_ + 1),
                                     (unsigned_long *)(__begin3.super_UntypedMapIterator.node_ + 2),
                                     target,stream);
        google::protobuf::internal::UntypedMapIterator::PlusPlus(&__begin3.super_UntypedMapIterator)
        ;
      }
    }
    else {
      google::protobuf::internal::
      MapSorterFlat<google::protobuf::Map<unsigned_long,_unsigned_long>_>::MapSorterFlat
                ((MapSorterFlat<google::protobuf::Map<unsigned_long,_unsigned_long>_> *)&__begin3,
                 (Map<unsigned_long,_unsigned_long> *)pMVar3);
      pUVar7 = __begin3.super_UntypedMapIterator.m_;
      for (lVar8 = (long)__begin3.super_UntypedMapIterator.node_ << 4; lVar8 != 0;
          lVar8 = lVar8 + -0x10) {
        target = google::protobuf::internal::
                 MapEntryFuncs<unsigned_long,_unsigned_long,_(google::protobuf::internal::WireFormatLite::FieldType)6,_(google::protobuf::internal::WireFormatLite::FieldType)6>
                 ::InternalSerialize(8,*(unsigned_long **)&pUVar7->index_of_first_non_null_,
                                     *(unsigned_long **)&pUVar7->index_of_first_non_null_ + 1,target
                                     ,stream);
        pUVar7 = (UntypedMapBase *)&pUVar7->table_;
      }
      std::
      unique_ptr<std::pair<unsigned_long,_const_void_*>[],_std::default_delete<std::pair<unsigned_long,_const_void_*>[]>_>
      ::~unique_ptr((unique_ptr<std::pair<unsigned_long,_const_void_*>[],_std::default_delete<std::pair<unsigned_long,_const_void_*>[]>_>
                     *)&__begin3.super_UntypedMapIterator.m_);
    }
  }
  iVar5 = *(int *)((long)&this->field_0 + 0x100);
  if (iVar5 != 0) {
    pMVar4 = &(this->field_0)._impl_.map_sfixed32_sfixed32_;
    if ((iVar5 == 1) || (stream->is_serialization_deterministic_ == false)) {
      google::protobuf::internal::UntypedMapBase::begin
                (&__begin3.super_UntypedMapIterator,(UntypedMapBase *)pMVar4);
      while (__begin3.super_UntypedMapIterator.node_ != (NodeBase *)0x0) {
        target = google::protobuf::internal::
                 MapEntryFuncs<int,_int,_(google::protobuf::internal::WireFormatLite::FieldType)15,_(google::protobuf::internal::WireFormatLite::FieldType)15>
                 ::InternalSerialize(9,(int *)(__begin3.super_UntypedMapIterator.node_ + 1),
                                     (int *)((long)&__begin3.super_UntypedMapIterator.node_[1].next
                                            + 4),target,stream);
        google::protobuf::internal::UntypedMapIterator::PlusPlus(&__begin3.super_UntypedMapIterator)
        ;
      }
    }
    else {
      google::protobuf::internal::MapSorterFlat<google::protobuf::Map<int,_int>_>::MapSorterFlat
                ((MapSorterFlat<google::protobuf::Map<int,_int>_> *)&__begin3,
                 (Map<int,_int> *)pMVar4);
      pUVar7 = __begin3.super_UntypedMapIterator.m_;
      for (lVar8 = (long)__begin3.super_UntypedMapIterator.node_ << 4; lVar8 != 0;
          lVar8 = lVar8 + -0x10) {
        target = google::protobuf::internal::
                 MapEntryFuncs<int,_int,_(google::protobuf::internal::WireFormatLite::FieldType)15,_(google::protobuf::internal::WireFormatLite::FieldType)15>
                 ::InternalSerialize(9,*(int **)&pUVar7->index_of_first_non_null_,
                                     *(int **)&pUVar7->index_of_first_non_null_ + 1,target,stream);
        pUVar7 = (UntypedMapBase *)&pUVar7->table_;
      }
      std::
      unique_ptr<std::pair<int,_const_void_*>[],_std::default_delete<std::pair<int,_const_void_*>[]>_>
      ::~unique_ptr((unique_ptr<std::pair<int,_const_void_*>[],_std::default_delete<std::pair<int,_const_void_*>[]>_>
                     *)&__begin3.super_UntypedMapIterator.m_);
    }
  }
  iVar5 = *(int *)((long)&this->field_0 + 0x120);
  if (iVar5 != 0) {
    pMVar1 = &(this->field_0)._impl_.map_sfixed64_sfixed64_;
    if ((iVar5 == 1) || (stream->is_serialization_deterministic_ == false)) {
      google::protobuf::internal::UntypedMapBase::begin
                (&__begin3.super_UntypedMapIterator,(UntypedMapBase *)pMVar1);
      while (__begin3.super_UntypedMapIterator.node_ != (NodeBase *)0x0) {
        target = google::protobuf::internal::
                 MapEntryFuncs<long,_long,_(google::protobuf::internal::WireFormatLite::FieldType)16,_(google::protobuf::internal::WireFormatLite::FieldType)16>
                 ::InternalSerialize(10,(long *)(__begin3.super_UntypedMapIterator.node_ + 1),
                                     (long *)(__begin3.super_UntypedMapIterator.node_ + 2),target,
                                     stream);
        google::protobuf::internal::UntypedMapIterator::PlusPlus(&__begin3.super_UntypedMapIterator)
        ;
      }
    }
    else {
      google::protobuf::internal::MapSorterFlat<google::protobuf::Map<long,_long>_>::MapSorterFlat
                ((MapSorterFlat<google::protobuf::Map<long,_long>_> *)&__begin3,
                 (Map<long,_long> *)pMVar1);
      pUVar7 = __begin3.super_UntypedMapIterator.m_;
      for (lVar8 = (long)__begin3.super_UntypedMapIterator.node_ << 4; lVar8 != 0;
          lVar8 = lVar8 + -0x10) {
        target = google::protobuf::internal::
                 MapEntryFuncs<long,_long,_(google::protobuf::internal::WireFormatLite::FieldType)16,_(google::protobuf::internal::WireFormatLite::FieldType)16>
                 ::InternalSerialize(10,*(long **)&pUVar7->index_of_first_non_null_,
                                     *(long **)&pUVar7->index_of_first_non_null_ + 1,target,stream);
        pUVar7 = (UntypedMapBase *)&pUVar7->table_;
      }
      std::
      unique_ptr<std::pair<long,_const_void_*>[],_std::default_delete<std::pair<long,_const_void_*>[]>_>
      ::~unique_ptr((unique_ptr<std::pair<long,_const_void_*>[],_std::default_delete<std::pair<long,_const_void_*>[]>_>
                     *)&__begin3.super_UntypedMapIterator.m_);
    }
  }
  iVar5 = *(int *)((long)&this->field_0 + 0x140);
  if (iVar5 != 0) {
    this_00 = &(this->field_0)._impl_.map_int32_float_;
    if ((iVar5 == 1) || (stream->is_serialization_deterministic_ == false)) {
      google::protobuf::internal::UntypedMapBase::begin
                (&__begin3.super_UntypedMapIterator,(UntypedMapBase *)this_00);
      while (__begin3.super_UntypedMapIterator.node_ != (NodeBase *)0x0) {
        target = google::protobuf::internal::
                 MapEntryFuncs<int,_float,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)2>
                 ::InternalSerialize(0xb,(int *)(__begin3.super_UntypedMapIterator.node_ + 1),
                                     (float *)((long)&__begin3.super_UntypedMapIterator.node_[1].
                                                      next + 4),target,stream);
        google::protobuf::internal::UntypedMapIterator::PlusPlus(&__begin3.super_UntypedMapIterator)
        ;
      }
    }
    else {
      google::protobuf::internal::MapSorterFlat<google::protobuf::Map<int,_float>_>::MapSorterFlat
                ((MapSorterFlat<google::protobuf::Map<int,_float>_> *)&__begin3,
                 (Map<int,_float> *)this_00);
      pUVar7 = __begin3.super_UntypedMapIterator.m_;
      for (lVar8 = (long)__begin3.super_UntypedMapIterator.node_ << 4; lVar8 != 0;
          lVar8 = lVar8 + -0x10) {
        target = google::protobuf::internal::
                 MapEntryFuncs<int,_float,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)2>
                 ::InternalSerialize(0xb,*(int **)&pUVar7->index_of_first_non_null_,
                                     (float *)(*(int **)&pUVar7->index_of_first_non_null_ + 1),
                                     target,stream);
        pUVar7 = (UntypedMapBase *)&pUVar7->table_;
      }
      std::
      unique_ptr<std::pair<int,_const_void_*>[],_std::default_delete<std::pair<int,_const_void_*>[]>_>
      ::~unique_ptr((unique_ptr<std::pair<int,_const_void_*>[],_std::default_delete<std::pair<int,_const_void_*>[]>_>
                     *)&__begin3.super_UntypedMapIterator.m_);
    }
  }
  iVar5 = *(int *)((long)&this->field_0 + 0x160);
  if (iVar5 != 0) {
    this_01 = &(this->field_0)._impl_.map_int32_double_;
    if ((iVar5 == 1) || (stream->is_serialization_deterministic_ == false)) {
      google::protobuf::internal::UntypedMapBase::begin
                (&__begin3.super_UntypedMapIterator,(UntypedMapBase *)this_01);
      while (__begin3.super_UntypedMapIterator.node_ != (NodeBase *)0x0) {
        target = google::protobuf::internal::
                 MapEntryFuncs<int,_double,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)1>
                 ::InternalSerialize(0xc,(int *)(__begin3.super_UntypedMapIterator.node_ + 1),
                                     (double *)(__begin3.super_UntypedMapIterator.node_ + 2),target,
                                     stream);
        google::protobuf::internal::UntypedMapIterator::PlusPlus(&__begin3.super_UntypedMapIterator)
        ;
      }
    }
    else {
      google::protobuf::internal::MapSorterFlat<google::protobuf::Map<int,_double>_>::MapSorterFlat
                ((MapSorterFlat<google::protobuf::Map<int,_double>_> *)&__begin3,
                 (Map<int,_double> *)this_01);
      pUVar7 = __begin3.super_UntypedMapIterator.m_;
      for (lVar8 = (long)__begin3.super_UntypedMapIterator.node_ << 4; lVar8 != 0;
          lVar8 = lVar8 + -0x10) {
        target = google::protobuf::internal::
                 MapEntryFuncs<int,_double,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)1>
                 ::InternalSerialize(0xc,*(int **)&pUVar7->index_of_first_non_null_,
                                     (double *)(*(int **)&pUVar7->index_of_first_non_null_ + 2),
                                     target,stream);
        pUVar7 = (UntypedMapBase *)&pUVar7->table_;
      }
      std::
      unique_ptr<std::pair<int,_const_void_*>[],_std::default_delete<std::pair<int,_const_void_*>[]>_>
      ::~unique_ptr((unique_ptr<std::pair<int,_const_void_*>[],_std::default_delete<std::pair<int,_const_void_*>[]>_>
                     *)&__begin3.super_UntypedMapIterator.m_);
    }
  }
  iVar5 = *(int *)((long)&this->field_0 + 0x180);
  if (iVar5 != 0) {
    this_02 = &(this->field_0)._impl_.map_bool_bool_;
    if ((iVar5 == 1) || (stream->is_serialization_deterministic_ == false)) {
      google::protobuf::internal::UntypedMapBase::begin
                (&__begin3.super_UntypedMapIterator,(UntypedMapBase *)this_02);
      while (__begin3.super_UntypedMapIterator.node_ != (NodeBase *)0x0) {
        target = google::protobuf::internal::
                 MapEntryFuncs<bool,_bool,_(google::protobuf::internal::WireFormatLite::FieldType)8,_(google::protobuf::internal::WireFormatLite::FieldType)8>
                 ::InternalSerialize(0xd,(bool *)(__begin3.super_UntypedMapIterator.node_ + 1),
                                     (bool *)((long)&__begin3.super_UntypedMapIterator.node_[1].next
                                             + 1),target,stream);
        google::protobuf::internal::UntypedMapIterator::PlusPlus(&__begin3.super_UntypedMapIterator)
        ;
      }
    }
    else {
      google::protobuf::internal::MapSorterFlat<google::protobuf::Map<bool,_bool>_>::MapSorterFlat
                ((MapSorterFlat<google::protobuf::Map<bool,_bool>_> *)&__begin3,
                 (Map<bool,_bool> *)this_02);
      pUVar7 = __begin3.super_UntypedMapIterator.m_;
      for (lVar8 = (long)__begin3.super_UntypedMapIterator.node_ << 4; lVar8 != 0;
          lVar8 = lVar8 + -0x10) {
        target = google::protobuf::internal::
                 MapEntryFuncs<bool,_bool,_(google::protobuf::internal::WireFormatLite::FieldType)8,_(google::protobuf::internal::WireFormatLite::FieldType)8>
                 ::InternalSerialize(0xd,*(bool **)&pUVar7->index_of_first_non_null_,
                                     *(bool **)&pUVar7->index_of_first_non_null_ + 1,target,stream);
        pUVar7 = (UntypedMapBase *)&pUVar7->table_;
      }
      std::
      unique_ptr<std::pair<bool,_const_void_*>[],_std::default_delete<std::pair<bool,_const_void_*>[]>_>
      ::~unique_ptr((unique_ptr<std::pair<bool,_const_void_*>[],_std::default_delete<std::pair<bool,_const_void_*>[]>_>
                     *)&__begin3.super_UntypedMapIterator.m_);
    }
  }
  iVar5 = *(int *)((long)&this->field_0 + 0x1a0);
  if (iVar5 != 0) {
    this_03 = &(this->field_0)._impl_.map_string_string_;
    if ((iVar5 == 1) || (stream->is_serialization_deterministic_ == false)) {
      google::protobuf::internal::UntypedMapBase::begin
                (&__begin3.super_UntypedMapIterator,(UntypedMapBase *)this_03);
      while (__begin3.super_UntypedMapIterator.node_ != (NodeBase *)0x0) {
        target = google::protobuf::internal::
                 MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9>
                 ::InternalSerialize(0xe,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)(__begin3.super_UntypedMapIterator.node_ + 1),
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(__begin3.super_UntypedMapIterator.node_ + 5),target,stream)
        ;
        google::protobuf::internal::UntypedMapIterator::PlusPlus(&__begin3.super_UntypedMapIterator)
        ;
      }
    }
    else {
      google::protobuf::internal::
      MapSorterPtr<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::MapSorterPtr((MapSorterPtr<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__begin3,
                     (Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this_03);
      pUVar7 = __begin3.super_UntypedMapIterator.m_;
      lVar8 = (long)__begin3.super_UntypedMapIterator.node_ << 3;
      for (lVar9 = 0; lVar8 != lVar9; lVar9 = lVar9 + 8) {
        key = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
               ((long)&pUVar7->num_elements_ + lVar9);
        target = google::protobuf::internal::
                 MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9>
                 ::InternalSerialize(0xe,key,key + 1,target,stream);
      }
      std::unique_ptr<const_void_*[],_std::default_delete<const_void_*[]>_>::~unique_ptr
                ((unique_ptr<const_void_*[],_std::default_delete<const_void_*[]>_> *)
                 &__begin3.super_UntypedMapIterator.m_);
    }
  }
  iVar5 = *(int *)((long)&this->field_0 + 0x1c0);
  if (iVar5 != 0) {
    this_04 = &(this->field_0)._impl_.map_int32_bytes_;
    if ((iVar5 == 1) || (stream->is_serialization_deterministic_ == false)) {
      google::protobuf::internal::UntypedMapBase::begin
                (&__begin3.super_UntypedMapIterator,(UntypedMapBase *)this_04);
      while (__begin3.super_UntypedMapIterator.node_ != (NodeBase *)0x0) {
        target = google::protobuf::internal::
                 MapEntryFuncs<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)12>
                 ::InternalSerialize(0xf,(int *)(__begin3.super_UntypedMapIterator.node_ + 1),
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(__begin3.super_UntypedMapIterator.node_ + 2),target,stream)
        ;
        google::protobuf::internal::UntypedMapIterator::PlusPlus(&__begin3.super_UntypedMapIterator)
        ;
      }
    }
    else {
      google::protobuf::internal::
      MapSorterFlat<google::protobuf::Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::MapSorterFlat((MapSorterFlat<google::protobuf::Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__begin3,
                      (Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)this_04);
      pUVar7 = __begin3.super_UntypedMapIterator.m_;
      for (lVar8 = (long)__begin3.super_UntypedMapIterator.node_ << 4; lVar8 != 0;
          lVar8 = lVar8 + -0x10) {
        target = google::protobuf::internal::
                 MapEntryFuncs<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)12>
                 ::InternalSerialize(0xf,*(int **)&pUVar7->index_of_first_non_null_,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(*(int **)&pUVar7->index_of_first_non_null_ + 2),target,
                                     stream);
        pUVar7 = (UntypedMapBase *)&pUVar7->table_;
      }
      std::
      unique_ptr<std::pair<int,_const_void_*>[],_std::default_delete<std::pair<int,_const_void_*>[]>_>
      ::~unique_ptr((unique_ptr<std::pair<int,_const_void_*>[],_std::default_delete<std::pair<int,_const_void_*>[]>_>
                     *)&__begin3.super_UntypedMapIterator.m_);
    }
  }
  iVar5 = *(int *)((long)&this->field_0 + 0x1e0);
  if (iVar5 != 0) {
    this_05 = &(this->field_0)._impl_.map_int32_enum_;
    if ((iVar5 == 1) || (stream->is_serialization_deterministic_ == false)) {
      google::protobuf::internal::UntypedMapBase::begin
                (&__begin3.super_UntypedMapIterator,(UntypedMapBase *)this_05);
      while (__begin3.super_UntypedMapIterator.node_ != (NodeBase *)0x0) {
        target = google::protobuf::internal::
                 MapEntryFuncs<int,_proto2_unittest::MapEnumLite,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)14>
                 ::InternalSerialize(0x10,(int *)(__begin3.super_UntypedMapIterator.node_ + 1),
                                     (MapEnumLite *)
                                     ((long)&__begin3.super_UntypedMapIterator.node_[1].next + 4),
                                     target,stream);
        google::protobuf::internal::UntypedMapIterator::PlusPlus(&__begin3.super_UntypedMapIterator)
        ;
      }
    }
    else {
      google::protobuf::internal::
      MapSorterFlat<google::protobuf::Map<int,_proto2_unittest::MapEnumLite>_>::MapSorterFlat
                ((MapSorterFlat<google::protobuf::Map<int,_proto2_unittest::MapEnumLite>_> *)
                 &__begin3,(Map<int,_proto2_unittest::MapEnumLite> *)this_05);
      pUVar7 = __begin3.super_UntypedMapIterator.m_;
      for (lVar8 = (long)__begin3.super_UntypedMapIterator.node_ << 4; lVar8 != 0;
          lVar8 = lVar8 + -0x10) {
        target = google::protobuf::internal::
                 MapEntryFuncs<int,_proto2_unittest::MapEnumLite,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)14>
                 ::InternalSerialize(0x10,*(int **)&pUVar7->index_of_first_non_null_,
                                     (MapEnumLite *)(*(int **)&pUVar7->index_of_first_non_null_ + 1)
                                     ,target,stream);
        pUVar7 = (UntypedMapBase *)&pUVar7->table_;
      }
      std::
      unique_ptr<std::pair<int,_const_void_*>[],_std::default_delete<std::pair<int,_const_void_*>[]>_>
      ::~unique_ptr((unique_ptr<std::pair<int,_const_void_*>[],_std::default_delete<std::pair<int,_const_void_*>[]>_>
                     *)&__begin3.super_UntypedMapIterator.m_);
    }
  }
  iVar5 = *(int *)((long)&this->field_0 + 0x200);
  if (iVar5 != 0) {
    this_06 = &(this->field_0)._impl_.map_int32_foreign_message_;
    if ((iVar5 == 1) || (stream->is_serialization_deterministic_ == false)) {
      google::protobuf::internal::UntypedMapBase::begin
                (&__begin3.super_UntypedMapIterator,(UntypedMapBase *)this_06);
      while (__begin3.super_UntypedMapIterator.node_ != (NodeBase *)0x0) {
        target = google::protobuf::internal::
                 MapEntryFuncs<int,_proto2_unittest::ForeignMessageLite,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)11>
                 ::InternalSerialize(0x11,(int *)(__begin3.super_UntypedMapIterator.node_ + 1),
                                     (ForeignMessageLite *)
                                     (__begin3.super_UntypedMapIterator.node_ + 2),target,stream);
        google::protobuf::internal::UntypedMapIterator::PlusPlus(&__begin3.super_UntypedMapIterator)
        ;
      }
    }
    else {
      google::protobuf::internal::
      MapSorterFlat<google::protobuf::Map<int,_proto2_unittest::ForeignMessageLite>_>::MapSorterFlat
                ((MapSorterFlat<google::protobuf::Map<int,_proto2_unittest::ForeignMessageLite>_> *)
                 &__begin3,(Map<int,_proto2_unittest::ForeignMessageLite> *)this_06);
      pUVar7 = __begin3.super_UntypedMapIterator.m_;
      for (lVar8 = (long)__begin3.super_UntypedMapIterator.node_ << 4; lVar8 != 0;
          lVar8 = lVar8 + -0x10) {
        target = google::protobuf::internal::
                 MapEntryFuncs<int,_proto2_unittest::ForeignMessageLite,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)11>
                 ::InternalSerialize(0x11,*(int **)&pUVar7->index_of_first_non_null_,
                                     (ForeignMessageLite *)
                                     (*(int **)&pUVar7->index_of_first_non_null_ + 2),target,stream)
        ;
        pUVar7 = (UntypedMapBase *)&pUVar7->table_;
      }
      std::
      unique_ptr<std::pair<int,_const_void_*>[],_std::default_delete<std::pair<int,_const_void_*>[]>_>
      ::~unique_ptr((unique_ptr<std::pair<int,_const_void_*>[],_std::default_delete<std::pair<int,_const_void_*>[]>_>
                     *)&__begin3.super_UntypedMapIterator.m_);
    }
  }
  iVar5 = *(int *)((long)&this->field_0 + 0x220);
  if (iVar5 != 0) {
    pMVar4 = &(this->field_0)._impl_.teboring_;
    if ((iVar5 == 1) || (stream->is_serialization_deterministic_ == false)) {
      google::protobuf::internal::UntypedMapBase::begin
                (&__begin3.super_UntypedMapIterator,(UntypedMapBase *)pMVar4);
      while (__begin3.super_UntypedMapIterator.node_ != (NodeBase *)0x0) {
        target = google::protobuf::internal::
                 MapEntryFuncs<int,_int,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)5>
                 ::InternalSerialize(0x12,(int *)(__begin3.super_UntypedMapIterator.node_ + 1),
                                     (int *)((long)&__begin3.super_UntypedMapIterator.node_[1].next
                                            + 4),target,stream);
        google::protobuf::internal::UntypedMapIterator::PlusPlus(&__begin3.super_UntypedMapIterator)
        ;
      }
    }
    else {
      google::protobuf::internal::MapSorterFlat<google::protobuf::Map<int,_int>_>::MapSorterFlat
                ((MapSorterFlat<google::protobuf::Map<int,_int>_> *)&__begin3,
                 (Map<int,_int> *)pMVar4);
      pUVar7 = __begin3.super_UntypedMapIterator.m_;
      for (lVar8 = (long)__begin3.super_UntypedMapIterator.node_ << 4; lVar8 != 0;
          lVar8 = lVar8 + -0x10) {
        target = google::protobuf::internal::
                 MapEntryFuncs<int,_int,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)5>
                 ::InternalSerialize(0x12,*(int **)&pUVar7->index_of_first_non_null_,
                                     *(int **)&pUVar7->index_of_first_non_null_ + 1,target,stream);
        pUVar7 = (UntypedMapBase *)&pUVar7->table_;
      }
      std::
      unique_ptr<std::pair<int,_const_void_*>[],_std::default_delete<std::pair<int,_const_void_*>[]>_>
      ::~unique_ptr((unique_ptr<std::pair<int,_const_void_*>[],_std::default_delete<std::pair<int,_const_void_*>[]>_>
                     *)&__begin3.super_UntypedMapIterator.m_);
    }
  }
  uVar6 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar6 & 1) != 0) {
    uVar6 = uVar6 & 0xfffffffffffffffe;
    target = google::protobuf::io::EpsCopyOutputStream::WriteRaw
                       (stream,*(void **)(uVar6 + 8),*(int *)(uVar6 + 0x10),target);
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestMapLite::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestMapLite& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.TestMapLite)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // map<int32, int32> map_int32_int32 = 1;
  if (!this_._internal_map_int32_int32().empty()) {
    using MapType = ::google::protobuf::Map<::int32_t, ::int32_t>;
    using WireHelper = _pbi::MapEntryFuncs<::int32_t, ::int32_t,
                                   _pbi::WireFormatLite::TYPE_INT32,
                                   _pbi::WireFormatLite::TYPE_INT32>;
    const auto& field = this_._internal_map_int32_int32();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterFlat<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            1, entry.first, entry.second, target, stream);
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            1, entry.first, entry.second, target, stream);
      }
    }
  }

  // map<int64, int64> map_int64_int64 = 2;
  if (!this_._internal_map_int64_int64().empty()) {
    using MapType = ::google::protobuf::Map<::int64_t, ::int64_t>;
    using WireHelper = _pbi::MapEntryFuncs<::int64_t, ::int64_t,
                                   _pbi::WireFormatLite::TYPE_INT64,
                                   _pbi::WireFormatLite::TYPE_INT64>;
    const auto& field = this_._internal_map_int64_int64();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterFlat<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            2, entry.first, entry.second, target, stream);
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            2, entry.first, entry.second, target, stream);
      }
    }
  }

  // map<uint32, uint32> map_uint32_uint32 = 3;
  if (!this_._internal_map_uint32_uint32().empty()) {
    using MapType = ::google::protobuf::Map<::uint32_t, ::uint32_t>;
    using WireHelper = _pbi::MapEntryFuncs<::uint32_t, ::uint32_t,
                                   _pbi::WireFormatLite::TYPE_UINT32,
                                   _pbi::WireFormatLite::TYPE_UINT32>;
    const auto& field = this_._internal_map_uint32_uint32();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterFlat<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            3, entry.first, entry.second, target, stream);
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            3, entry.first, entry.second, target, stream);
      }
    }
  }

  // map<uint64, uint64> map_uint64_uint64 = 4;
  if (!this_._internal_map_uint64_uint64().empty()) {
    using MapType = ::google::protobuf::Map<::uint64_t, ::uint64_t>;
    using WireHelper = _pbi::MapEntryFuncs<::uint64_t, ::uint64_t,
                                   _pbi::WireFormatLite::TYPE_UINT64,
                                   _pbi::WireFormatLite::TYPE_UINT64>;
    const auto& field = this_._internal_map_uint64_uint64();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterFlat<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            4, entry.first, entry.second, target, stream);
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            4, entry.first, entry.second, target, stream);
      }
    }
  }

  // map<sint32, sint32> map_sint32_sint32 = 5;
  if (!this_._internal_map_sint32_sint32().empty()) {
    using MapType = ::google::protobuf::Map<::int32_t, ::int32_t>;
    using WireHelper = _pbi::MapEntryFuncs<::int32_t, ::int32_t,
                                   _pbi::WireFormatLite::TYPE_SINT32,
                                   _pbi::WireFormatLite::TYPE_SINT32>;
    const auto& field = this_._internal_map_sint32_sint32();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterFlat<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            5, entry.first, entry.second, target, stream);
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            5, entry.first, entry.second, target, stream);
      }
    }
  }

  // map<sint64, sint64> map_sint64_sint64 = 6;
  if (!this_._internal_map_sint64_sint64().empty()) {
    using MapType = ::google::protobuf::Map<::int64_t, ::int64_t>;
    using WireHelper = _pbi::MapEntryFuncs<::int64_t, ::int64_t,
                                   _pbi::WireFormatLite::TYPE_SINT64,
                                   _pbi::WireFormatLite::TYPE_SINT64>;
    const auto& field = this_._internal_map_sint64_sint64();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterFlat<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            6, entry.first, entry.second, target, stream);
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            6, entry.first, entry.second, target, stream);
      }
    }
  }

  // map<fixed32, fixed32> map_fixed32_fixed32 = 7;
  if (!this_._internal_map_fixed32_fixed32().empty()) {
    using MapType = ::google::protobuf::Map<::uint32_t, ::uint32_t>;
    using WireHelper = _pbi::MapEntryFuncs<::uint32_t, ::uint32_t,
                                   _pbi::WireFormatLite::TYPE_FIXED32,
                                   _pbi::WireFormatLite::TYPE_FIXED32>;
    const auto& field = this_._internal_map_fixed32_fixed32();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterFlat<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            7, entry.first, entry.second, target, stream);
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            7, entry.first, entry.second, target, stream);
      }
    }
  }

  // map<fixed64, fixed64> map_fixed64_fixed64 = 8;
  if (!this_._internal_map_fixed64_fixed64().empty()) {
    using MapType = ::google::protobuf::Map<::uint64_t, ::uint64_t>;
    using WireHelper = _pbi::MapEntryFuncs<::uint64_t, ::uint64_t,
                                   _pbi::WireFormatLite::TYPE_FIXED64,
                                   _pbi::WireFormatLite::TYPE_FIXED64>;
    const auto& field = this_._internal_map_fixed64_fixed64();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterFlat<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            8, entry.first, entry.second, target, stream);
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            8, entry.first, entry.second, target, stream);
      }
    }
  }

  // map<sfixed32, sfixed32> map_sfixed32_sfixed32 = 9;
  if (!this_._internal_map_sfixed32_sfixed32().empty()) {
    using MapType = ::google::protobuf::Map<::int32_t, ::int32_t>;
    using WireHelper = _pbi::MapEntryFuncs<::int32_t, ::int32_t,
                                   _pbi::WireFormatLite::TYPE_SFIXED32,
                                   _pbi::WireFormatLite::TYPE_SFIXED32>;
    const auto& field = this_._internal_map_sfixed32_sfixed32();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterFlat<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            9, entry.first, entry.second, target, stream);
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            9, entry.first, entry.second, target, stream);
      }
    }
  }

  // map<sfixed64, sfixed64> map_sfixed64_sfixed64 = 10;
  if (!this_._internal_map_sfixed64_sfixed64().empty()) {
    using MapType = ::google::protobuf::Map<::int64_t, ::int64_t>;
    using WireHelper = _pbi::MapEntryFuncs<::int64_t, ::int64_t,
                                   _pbi::WireFormatLite::TYPE_SFIXED64,
                                   _pbi::WireFormatLite::TYPE_SFIXED64>;
    const auto& field = this_._internal_map_sfixed64_sfixed64();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterFlat<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            10, entry.first, entry.second, target, stream);
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            10, entry.first, entry.second, target, stream);
      }
    }
  }

  // map<int32, float> map_int32_float = 11;
  if (!this_._internal_map_int32_float().empty()) {
    using MapType = ::google::protobuf::Map<::int32_t, float>;
    using WireHelper = _pbi::MapEntryFuncs<::int32_t, float,
                                   _pbi::WireFormatLite::TYPE_INT32,
                                   _pbi::WireFormatLite::TYPE_FLOAT>;
    const auto& field = this_._internal_map_int32_float();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterFlat<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            11, entry.first, entry.second, target, stream);
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            11, entry.first, entry.second, target, stream);
      }
    }
  }

  // map<int32, double> map_int32_double = 12;
  if (!this_._internal_map_int32_double().empty()) {
    using MapType = ::google::protobuf::Map<::int32_t, double>;
    using WireHelper = _pbi::MapEntryFuncs<::int32_t, double,
                                   _pbi::WireFormatLite::TYPE_INT32,
                                   _pbi::WireFormatLite::TYPE_DOUBLE>;
    const auto& field = this_._internal_map_int32_double();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterFlat<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            12, entry.first, entry.second, target, stream);
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            12, entry.first, entry.second, target, stream);
      }
    }
  }

  // map<bool, bool> map_bool_bool = 13;
  if (!this_._internal_map_bool_bool().empty()) {
    using MapType = ::google::protobuf::Map<bool, bool>;
    using WireHelper = _pbi::MapEntryFuncs<bool, bool,
                                   _pbi::WireFormatLite::TYPE_BOOL,
                                   _pbi::WireFormatLite::TYPE_BOOL>;
    const auto& field = this_._internal_map_bool_bool();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterFlat<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            13, entry.first, entry.second, target, stream);
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            13, entry.first, entry.second, target, stream);
      }
    }
  }

  // map<string, string> map_string_string = 14;
  if (!this_._internal_map_string_string().empty()) {
    using MapType = ::google::protobuf::Map<std::string, std::string>;
    using WireHelper = _pbi::MapEntryFuncs<std::string, std::string,
                                   _pbi::WireFormatLite::TYPE_STRING,
                                   _pbi::WireFormatLite::TYPE_STRING>;
    const auto& field = this_._internal_map_string_string();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterPtr<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            14, entry.first, entry.second, target, stream);
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            14, entry.first, entry.second, target, stream);
      }
    }
  }

  // map<int32, bytes> map_int32_bytes = 15;
  if (!this_._internal_map_int32_bytes().empty()) {
    using MapType = ::google::protobuf::Map<::int32_t, std::string>;
    using WireHelper = _pbi::MapEntryFuncs<::int32_t, std::string,
                                   _pbi::WireFormatLite::TYPE_INT32,
                                   _pbi::WireFormatLite::TYPE_BYTES>;
    const auto& field = this_._internal_map_int32_bytes();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterFlat<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            15, entry.first, entry.second, target, stream);
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            15, entry.first, entry.second, target, stream);
      }
    }
  }

  // map<int32, .proto2_unittest.MapEnumLite> map_int32_enum = 16;
  if (!this_._internal_map_int32_enum().empty()) {
    using MapType = ::google::protobuf::Map<::int32_t, ::proto2_unittest::MapEnumLite>;
    using WireHelper = _pbi::MapEntryFuncs<::int32_t, ::proto2_unittest::MapEnumLite,
                                   _pbi::WireFormatLite::TYPE_INT32,
                                   _pbi::WireFormatLite::TYPE_ENUM>;
    const auto& field = this_._internal_map_int32_enum();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterFlat<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            16, entry.first, entry.second, target, stream);
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            16, entry.first, entry.second, target, stream);
      }
    }
  }

  // map<int32, .proto2_unittest.ForeignMessageLite> map_int32_foreign_message = 17;
  if (!this_._internal_map_int32_foreign_message().empty()) {
    using MapType = ::google::protobuf::Map<::int32_t, ::proto2_unittest::ForeignMessageLite>;
    using WireHelper = _pbi::MapEntryFuncs<::int32_t, ::proto2_unittest::ForeignMessageLite,
                                   _pbi::WireFormatLite::TYPE_INT32,
                                   _pbi::WireFormatLite::TYPE_MESSAGE>;
    const auto& field = this_._internal_map_int32_foreign_message();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterFlat<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            17, entry.first, entry.second, target, stream);
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            17, entry.first, entry.second, target, stream);
      }
    }
  }

  // map<int32, int32> teboring = 18;
  if (!this_._internal_teboring().empty()) {
    using MapType = ::google::protobuf::Map<::int32_t, ::int32_t>;
    using WireHelper = _pbi::MapEntryFuncs<::int32_t, ::int32_t,
                                   _pbi::WireFormatLite::TYPE_INT32,
                                   _pbi::WireFormatLite::TYPE_INT32>;
    const auto& field = this_._internal_teboring();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterFlat<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            18, entry.first, entry.second, target, stream);
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            18, entry.first, entry.second, target, stream);
      }
    }
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(
        this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).data(),
        static_cast<int>(this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.TestMapLite)
  return target;
}